

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::build_resp_str(coro_http_response *this,string *resp_str)

{
  char *__first;
  bool *pbVar1;
  unsigned_long __value;
  undefined1 *puVar2;
  vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *resp_headers;
  __integer_to_chars_result_type<unsigned_long> _Var3;
  bool has_host;
  bool has_len;
  vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *local_48;
  string_view local_40;
  
  local_40 = to_http_status_string(this->status_);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)resp_str,&local_40);
  has_len = false;
  has_host = false;
  resp_headers = &this->resp_headers_;
  check_header<std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (this,resp_headers,&has_len,&has_host);
  if ((this->resp_header_span_)._M_extent._M_extent_value != 0) {
    check_header<std::span<cinatra::http_header,18446744073709551615ul>>
              (this,&this->resp_header_span_,&has_len,&has_host);
  }
  if (has_host == false) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)resp_str,
               (basic_string_view<char,_std::char_traits<char>_> *)CINATRA_HOST_SV);
  }
  if ((((this->content_)._M_string_length == 0) && (this->has_set_content_ == false)) &&
     (this->fmt_type_ != chunked)) {
    local_40 = default_status_content(this->status_);
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->content_,&local_40);
  }
  if (this->fmt_type_ == chunked) {
    puVar2 = TRANSFER_ENCODING_SV;
  }
  else {
    __value = (this->content_)._M_string_length;
    if ((__value != 0) || (__value = (this->content_view_)._M_len, __value != 0)) {
      __first = this->buf_;
      _Var3 = std::__to_chars_i<unsigned_long>(__first,&this->field_0x4b,__value,10);
      local_48 = resp_headers;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)resp_str,
                 (basic_string_view<char,_std::char_traits<char>_> *)CONTENT_LENGTH_SV);
      resp_headers = local_48;
      local_40._M_str = __first;
      local_40._M_len = (long)_Var3.ptr - (long)__first;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)resp_str,&local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (resp_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &CRCF_abi_cxx11_);
      goto LAB_001424fc;
    }
    if ((has_len != false) || ((this->boundary_)._M_string_length != 0)) goto LAB_001424fc;
    puVar2 = ZERO_LENGTH_SV;
  }
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)resp_str,(basic_string_view<char,_std::char_traits<char>_> *)puVar2);
LAB_001424fc:
  if (this->need_date_ == true) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)resp_str,(basic_string_view<char,_std::char_traits<char>_> *)DATE_SV);
    local_40 = get_gmt_time_str();
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)resp_str,&local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &CRCF_abi_cxx11_);
  }
  if ((this->keepalive_).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true) {
    pbVar1 = std::optional<bool>::value(&this->keepalive_);
    puVar2 = CONN_CLOSE_SV;
    if (*pbVar1 != false) {
      puVar2 = CONN_KEEP_SV;
    }
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)resp_str,(basic_string_view<char,_std::char_traits<char>_> *)puVar2);
  }
  append_header_str<std::__cxx11::string,std::vector<cinatra::resp_header,std::allocator<cinatra::resp_header>>>
            (this,resp_str,resp_headers);
  if ((this->resp_header_span_)._M_extent._M_extent_value != 0) {
    append_header_str<std::__cxx11::string,std::span<cinatra::http_header,18446744073709551615ul>>
              (this,resp_str,&this->resp_header_span_);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (resp_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &CRCF_abi_cxx11_);
  if ((this->content_view_)._M_len == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (resp_str,&this->content_);
  }
  else {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)resp_str,&this->content_view_);
  }
  return;
}

Assistant:

void build_resp_str(std::string &resp_str) {
    resp_str.append(to_http_status_string(status_));
    bool has_len = false;
    bool has_host = false;
    check_header(resp_headers_, has_len, has_host);
    if (!resp_header_span_.empty()) {
      check_header(resp_header_span_, has_len, has_host);
    }

    if (!has_host) {
      resp_str.append(CINATRA_HOST_SV);
    }

    if (content_.empty() && !has_set_content_ &&
        fmt_type_ != format_type::chunked) {
      content_.append(default_status_content(status_));
    }

    if (fmt_type_ == format_type::chunked) {
      resp_str.append(TRANSFER_ENCODING_SV);
    }
    else {
      if (!content_.empty() || !content_view_.empty()) {
        size_t content_size =
            content_.empty() ? content_view_.size() : content_.size();
        auto [ptr, ec] = std::to_chars(buf_, buf_ + 32, content_size);
        resp_str.append(CONTENT_LENGTH_SV);
        resp_str.append(std::string_view(buf_, std::distance(buf_, ptr)));
        resp_str.append(CRCF);
      }
      else {
        if (!has_len && boundary_.empty())
          resp_str.append(ZERO_LENGTH_SV);
      }
    }

    if (need_date_) {
      resp_str.append(DATE_SV);
      resp_str.append(get_gmt_time_str());
      resp_str.append(CRCF);
    }

    if (keepalive_.has_value()) {
      bool keepalive = keepalive_.value();
      keepalive ? resp_str.append(CONN_KEEP_SV)
                : resp_str.append(CONN_CLOSE_SV);
    }

    append_header_str(resp_str, resp_headers_);

    if (!resp_header_span_.empty()) {
      append_header_str(resp_str, resp_header_span_);
    }

    resp_str.append(CRCF);
    if (content_view_.empty()) {
      resp_str.append(content_);
    }
    else {
      resp_str.append(content_view_);
    }
  }